

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usda-reader.cc
# Opt level: O1

bool __thiscall tinyusdz::usda::USDAReader::Impl::ReconstructStage(Impl *this)

{
  pointer pPVar1;
  pointer pPVar2;
  size_t *psVar3;
  bool bVar4;
  size_t *psVar5;
  pointer this_00;
  bool bVar6;
  Prim prim;
  storage_union local_398;
  undefined **local_388;
  Prim local_380;
  
  pPVar1 = (this->_stage)._root_nodes.
           super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>._M_impl.
           super__Vector_impl_data._M_start;
  pPVar2 = (this->_stage)._root_nodes.
           super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>._M_impl.
           super__Vector_impl_data._M_finish;
  this_00 = pPVar1;
  if (pPVar2 != pPVar1) {
    do {
      Prim::~Prim(this_00);
      this_00 = this_00 + 1;
    } while (this_00 != pPVar2);
    (this->_stage)._root_nodes.super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>.
    _M_impl.super__Vector_impl_data._M_finish = pPVar1;
  }
  psVar5 = (this->_toplevel_prims).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar3 = (this->_toplevel_prims).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  bVar6 = psVar5 == psVar3;
  if (!bVar6) {
    do {
      local_388 = &linb::any::vtable_for_type<decltype(nullptr)>()::table;
      local_398.dynamic = (void *)0x0;
      Prim::Prim(&local_380,(Value *)&local_398);
      if (local_388 != (undefined **)0x0) {
        (*(code *)local_388[4])(&local_398);
        local_388 = (undefined **)0x0;
      }
      bVar4 = anon_unknown_1::ConstructPrimTreeRec
                        (*psVar5,&this->_prim_nodes,&local_380,&this->_err);
      if (!bVar4) {
        Prim::~Prim(&local_380);
        if (bVar6 == false) {
          return false;
        }
        break;
      }
      ::std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>::emplace_back<tinyusdz::Prim>
                ((vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_> *)this,&local_380);
      Prim::~Prim(&local_380);
      psVar5 = psVar5 + 1;
      bVar6 = psVar5 == psVar3;
    } while (!bVar6);
  }
  Stage::compute_absolute_prim_path_and_assign_prim_id(&this->_stage,true);
  return bVar6;
}

Assistant:

bool USDAReader::Impl::ReconstructStage() {
  _stage.root_prims().clear();

  for (const auto &idx : _toplevel_prims) {
    DCOUT("Toplevel prim idx: " << std::to_string(idx));

    Prim prim(value::Value(nullptr)); // init with dummy Prim
    if (!ConstructPrimTreeRec(idx, _prim_nodes, &prim, &_err)) {
      return false;
    }

    _stage.root_prims().emplace_back(std::move(prim));

    DCOUT("num_children = " << _stage.root_prims()[size_t(_stage.root_prims().size() - 1)].children().size());
  }

  // Compute Abs Path from built Prim tree and Assign prim id.
  _stage.compute_absolute_prim_path_and_assign_prim_id();

  return true;
}